

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O2

int mbedtls_camellia_setkey_enc(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  uint32_t *__s;
  uint32_t *z;
  uint uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uchar *puVar10;
  uint32_t *puVar11;
  uint auStack_168 [5];
  uint local_154;
  uint32_t KC [16];
  undefined8 local_108;
  undefined8 local_100;
  uint32_t TK [20];
  uint32_t SIGMA [6] [2];
  uchar t [64];
  
  __s = ctx->rk;
  t[0] = '\0';
  t[1] = '\0';
  t[2] = '\0';
  t[3] = '\0';
  t[4] = '\0';
  t[5] = '\0';
  t[6] = '\0';
  t[7] = '\0';
  t[8] = '\0';
  t[9] = '\0';
  t[10] = '\0';
  t[0xb] = '\0';
  t[0xc] = '\0';
  t[0xd] = '\0';
  t[0xe] = '\0';
  t[0xf] = '\0';
  t[0x10] = '\0';
  t[0x11] = '\0';
  t[0x12] = '\0';
  t[0x13] = '\0';
  t[0x14] = '\0';
  t[0x15] = '\0';
  t[0x16] = '\0';
  t[0x17] = '\0';
  t[0x18] = '\0';
  t[0x19] = '\0';
  t[0x1a] = '\0';
  t[0x1b] = '\0';
  t[0x1c] = '\0';
  t[0x1d] = '\0';
  t[0x1e] = '\0';
  t[0x1f] = '\0';
  t[0x20] = '\0';
  t[0x21] = '\0';
  t[0x22] = '\0';
  t[0x23] = '\0';
  t[0x24] = '\0';
  t[0x25] = '\0';
  t[0x26] = '\0';
  t[0x27] = '\0';
  t[0x28] = '\0';
  t[0x29] = '\0';
  t[0x2a] = '\0';
  t[0x2b] = '\0';
  t[0x2c] = '\0';
  t[0x2d] = '\0';
  t[0x2e] = '\0';
  t[0x2f] = '\0';
  t[0x30] = '\0';
  t[0x31] = '\0';
  t[0x32] = '\0';
  t[0x33] = '\0';
  t[0x34] = '\0';
  t[0x35] = '\0';
  t[0x36] = '\0';
  t[0x37] = '\0';
  t[0x38] = '\0';
  t[0x39] = '\0';
  t[0x3a] = '\0';
  t[0x3b] = '\0';
  t[0x3c] = '\0';
  t[0x3d] = '\0';
  t[0x3e] = '\0';
  t[0x3f] = '\0';
  lVar9 = 0;
  auStack_168[2] = 0x18128d;
  auStack_168[3] = 0;
  memset(__s,0,0x110);
  if (keybits == 0x80) {
    iVar8 = 3;
  }
  else {
    if ((keybits != 0x100) && (keybits != 0xc0)) {
      return -0x24;
    }
    lVar9 = 1;
    iVar8 = 4;
  }
  ctx->nr = iVar8;
  for (uVar5 = 0; keybits >> 3 != uVar5; uVar5 = uVar5 + 1) {
    t[uVar5] = key[uVar5];
  }
  if (keybits == 0xc0) {
    for (lVar4 = -8; lVar4 != 0; lVar4 = lVar4 + 1) {
      t[lVar4 + 0x20] = ~t[lVar4 + 0x18];
    }
  }
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)SIGMA_CHARS[lVar4];
    uVar2 = *(uint *)(SIGMA_CHARS[lVar4] + 4);
    SIGMA[lVar4][0] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    SIGMA[lVar4][1] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  KC[0xc] = 0;
  KC[0xd] = 0;
  KC[0xe] = 0;
  KC[0xf] = 0;
  KC[8] = 0;
  KC[9] = 0;
  KC[10] = 0;
  KC[0xb] = 0;
  KC[4] = 0;
  KC[5] = 0;
  KC[6] = 0;
  KC[7] = 0;
  KC[0] = 0;
  KC[1] = 0;
  KC[2] = 0;
  KC[3] = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)(t + lVar4 * 4);
    KC[lVar4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (lVar4 = 8; lVar4 != 0xc; lVar4 = lVar4 + 1) {
    KC[lVar4] = auStack_168[lVar4 + 4] ^ auStack_168[lVar4];
  }
  puVar11 = KC + 8;
  z = KC + 10;
  auStack_168[2] = 0x181395;
  auStack_168[3] = 0;
  local_154 = keybits;
  local_100 = ctx;
  camellia_feistel(puVar11,SIGMA[0],z);
  auStack_168[2] = 0x1813a8;
  auStack_168[3] = 0;
  camellia_feistel(z,SIGMA[1],puVar11);
  for (lVar4 = 8; lVar4 != 0xc; lVar4 = lVar4 + 1) {
    KC[lVar4] = KC[lVar4] ^ auStack_168[lVar4];
  }
  auStack_168[2] = 0x1813d1;
  auStack_168[3] = 0;
  camellia_feistel(puVar11,SIGMA[2],z);
  auStack_168[2] = 0x1813e4;
  auStack_168[3] = 0;
  camellia_feistel(z,SIGMA[3],puVar11);
  if (0x80 < local_154) {
    for (lVar4 = -0x10; lVar4 != 0; lVar4 = lVar4 + 4) {
      *(uint *)((long)&local_108 + lVar4) =
           *(uint *)((long)KC + lVar4 + 0x30) ^ *(uint *)((long)KC + lVar4 + 0x20);
    }
    auStack_168[2] = 0x181425;
    auStack_168[3] = 0;
    camellia_feistel(KC + 0xc,SIGMA[4],KC + 0xe);
    auStack_168[2] = 0x181438;
    auStack_168[3] = 0;
    camellia_feistel(KC + 0xe,SIGMA[5],KC + 0xc);
  }
  TK[0] = KC[0];
  TK[1] = KC[1];
  TK[2] = KC[2];
  TK[3] = KC[3];
  iVar8 = (int)lVar9;
  puVar10 = shifts[0][0] + (uint)(iVar8 << 4);
  bVar3 = 0xf;
  for (lVar4 = 0x1c; lVar4 != 0x5c; lVar4 = lVar4 + 0x10) {
    if (*puVar10 != '\0') {
      bVar6 = -(bVar3 & 0x1f);
      *(uint32_t *)((long)&local_108 + lVar4 + 4) =
           KC[1] >> (bVar6 & 0x1f) ^ KC[0] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4 + -8) = KC[2] >> (bVar6 & 0x1f) ^ KC[1] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4 + -4) = KC[3] >> (bVar6 & 0x1f) ^ KC[2] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4) = KC[0] >> (bVar6 & 0x1f) ^ KC[3] << (bVar3 & 0x1f);
    }
    bVar3 = bVar3 + 0xf;
    puVar10 = puVar10 + 1;
  }
  local_108 = lVar9 * 0x50;
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    lVar7 = (long)indexes[lVar9][0][lVar4];
    if (lVar7 != -1) {
      __s[lVar7] = TK[lVar4];
    }
  }
  if (0x80 < local_154) {
    puVar11 = TK + 7;
    TK[0] = KC[4];
    TK[1] = KC[5];
    TK[2] = KC[6];
    TK[3] = KC[7];
    bVar3 = 0xf;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (*(char *)((ulong)(uint)(iVar8 << 4) + 0x1990e4 + lVar4) != '\0') {
        bVar6 = -(bVar3 & 0x1f);
        puVar11[-3] = KC[5] >> (bVar6 & 0x1f) ^ KC[4] << (bVar3 & 0x1f);
        puVar11[-2] = KC[6] >> (bVar6 & 0x1f) ^ KC[5] << (bVar3 & 0x1f);
        puVar11[-1] = KC[7] >> (bVar6 & 0x1f) ^ KC[6] << (bVar3 & 0x1f);
        *puVar11 = KC[4] >> (bVar6 & 0x1f) ^ KC[7] << (bVar3 & 0x1f);
      }
      bVar3 = bVar3 + 0xf;
      puVar11 = puVar11 + 4;
    }
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
      lVar7 = (long)*(char *)(local_108 + 0x198854 + lVar4);
      if (lVar7 != -1) {
        __s[lVar7] = TK[lVar4];
      }
    }
  }
  TK[0] = KC[8];
  TK[1] = KC[9];
  TK[2] = KC[10];
  TK[3] = KC[0xb];
  puVar10 = shifts[0][2] + (uint)(iVar8 << 4);
  bVar3 = 0xf;
  for (lVar4 = 0x1c; lVar4 != 0x5c; lVar4 = lVar4 + 0x10) {
    if (*puVar10 != '\0') {
      bVar6 = -(bVar3 & 0x1f);
      *(uint32_t *)((long)&local_108 + lVar4 + 4) =
           KC[9] >> (bVar6 & 0x1f) ^ KC[8] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4 + -8) = KC[10] >> (bVar6 & 0x1f) ^ KC[9] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4 + -4) = KC[0xb] >> (bVar6 & 0x1f) ^ KC[10] << (bVar3 & 0x1f);
      *(uint32_t *)((long)TK + lVar4) = KC[8] >> (bVar6 & 0x1f) ^ KC[0xb] << (bVar3 & 0x1f);
    }
    bVar3 = bVar3 + 0xf;
    puVar10 = puVar10 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    lVar7 = (long)*(char *)(local_108 + 0x198868 + lVar4);
    if (lVar7 != -1) {
      __s[lVar7] = TK[lVar4];
    }
  }
  if (0x80 < local_154) {
    puVar11 = TK + 7;
    TK[0] = KC[0xc];
    TK[1] = KC[0xd];
    TK[2] = KC[0xe];
    TK[3] = KC[0xf];
    bVar3 = 0xf;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (*(char *)((ulong)(uint)(iVar8 << 4) + 0x1990ec + lVar4) != '\0') {
        bVar6 = -(bVar3 & 0x1f);
        puVar11[-3] = KC[0xd] >> (bVar6 & 0x1f) ^ KC[0xc] << (bVar3 & 0x1f);
        puVar11[-2] = KC[0xe] >> (bVar6 & 0x1f) ^ KC[0xd] << (bVar3 & 0x1f);
        puVar11[-1] = KC[0xf] >> (bVar6 & 0x1f) ^ KC[0xe] << (bVar3 & 0x1f);
        *puVar11 = KC[0xc] >> (bVar6 & 0x1f) ^ KC[0xf] << (bVar3 & 0x1f);
      }
      bVar3 = bVar3 + 0xf;
      puVar11 = puVar11 + 4;
    }
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
      lVar7 = (long)*(char *)(local_108 + 0x19887c + lVar4);
      if (lVar7 != -1) {
        __s[lVar7] = TK[lVar4];
      }
    }
  }
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    if ((long)transposes[lVar9][lVar4] != -1) {
      local_100->rk[lVar9 * 0xc + lVar4 + 0x20] = __s[transposes[lVar9][lVar4]];
    }
  }
  return 0;
}

Assistant:

int mbedtls_camellia_setkey_enc( mbedtls_camellia_context *ctx, const unsigned char *key,
                         unsigned int keybits )
{
    int idx;
    size_t i;
    uint32_t *RK;
    unsigned char t[64];
    uint32_t SIGMA[6][2];
    uint32_t KC[16];
    uint32_t TK[20];

    RK = ctx->rk;

    memset( t, 0, 64 );
    memset( RK, 0, sizeof(ctx->rk) );

    switch( keybits )
    {
        case 128: ctx->nr = 3; idx = 0; break;
        case 192:
        case 256: ctx->nr = 4; idx = 1; break;
        default : return( MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH );
    }

    for( i = 0; i < keybits / 8; ++i )
        t[i] = key[i];

    if( keybits == 192 ) {
        for( i = 0; i < 8; i++ )
            t[24 + i] = ~t[16 + i];
    }

    /*
     * Prepare SIGMA values
     */
    for( i = 0; i < 6; i++ ) {
        GET_UINT32_BE( SIGMA[i][0], SIGMA_CHARS[i], 0 );
        GET_UINT32_BE( SIGMA[i][1], SIGMA_CHARS[i], 4 );
    }

    /*
     * Key storage in KC
     * Order: KL, KR, KA, KB
     */
    memset( KC, 0, sizeof(KC) );

    /* Store KL, KR */
    for( i = 0; i < 8; i++ )
        GET_UINT32_BE( KC[i], t, i * 4 );

    /* Generate KA */
    for( i = 0; i < 4; ++i )
        KC[8 + i] = KC[i] ^ KC[4 + i];

    camellia_feistel( KC + 8, SIGMA[0], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[1], KC + 8 );

    for( i = 0; i < 4; ++i )
        KC[8 + i] ^= KC[i];

    camellia_feistel( KC + 8, SIGMA[2], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[3], KC + 8 );

    if( keybits > 128 ) {
        /* Generate KB */
        for( i = 0; i < 4; ++i )
            KC[12 + i] = KC[4 + i] ^ KC[8 + i];

        camellia_feistel( KC + 12, SIGMA[4], KC + 14 );
        camellia_feistel( KC + 14, SIGMA[5], KC + 12 );
    }

    /*
     * Generating subkeys
     */

    /* Manipulating KL */
    SHIFT_AND_PLACE( idx, 0 );

    /* Manipulating KR */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 1 );
    }

    /* Manipulating KA */
    SHIFT_AND_PLACE( idx, 2 );

    /* Manipulating KB */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 3 );
    }

    /* Do transpositions */
    for( i = 0; i < 20; i++ ) {
        if( transposes[idx][i] != -1 ) {
            RK[32 + 12 * idx + i] = RK[transposes[idx][i]];
        }
    }

    return( 0 );
}